

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

void atomic(lua_State *L)

{
  global_State *g;
  GCObject *pGVar1;
  GCObject *pGVar2;
  lua_State *plVar3;
  UpVal *pUVar4;
  lua_State **pplVar5;
  
  g = L->l_G;
  pGVar1 = g->grayagain;
  g->grayagain = (GCObject *)0x0;
  g->gcstate = '\x02';
  if ((L->marked & 0x18) != 0) {
    reallymarkobject(g,(GCObject *)L);
  }
  if ((((g->l_registry).tt_ & 0x40) != 0) &&
     (pGVar2 = (g->l_registry).value_.gc, (pGVar2->marked & 0x18) != 0)) {
    reallymarkobject(g,pGVar2);
  }
  markmt(g);
  while (g->gray != (GCObject *)0x0) {
    propagatemark(g);
  }
  plVar3 = g->twups;
  if (plVar3 != (lua_State *)0x0) {
    pplVar5 = &g->twups;
    do {
      if (((plVar3->marked & 0x18) == 0) && (plVar3->openupval != (UpVal *)0x0)) {
        pplVar5 = &plVar3->twups;
      }
      else {
        *pplVar5 = plVar3->twups;
        plVar3->twups = plVar3;
        for (pUVar4 = plVar3->openupval; pUVar4 != (UpVal *)0x0; pUVar4 = (pUVar4->u).open.next) {
          if ((((pUVar4->marked & 0x18) == 0) && ((((pUVar4->v).p)->tt_ & 0x40) != 0)) &&
             (pGVar2 = (((pUVar4->v).p)->value_).gc, (pGVar2->marked & 0x18) != 0)) {
            reallymarkobject(g,pGVar2);
          }
        }
      }
      plVar3 = *pplVar5;
    } while (plVar3 != (lua_State *)0x0);
    while (g->gray != (GCObject *)0x0) {
      propagatemark(g);
    }
  }
  g->gray = pGVar1;
  while (pGVar1 != (GCObject *)0x0) {
    propagatemark(g);
    pGVar1 = g->gray;
  }
  convergeephemerons(g);
  clearbyvalues(g,g->weak,(GCObject *)0x0);
  clearbyvalues(g,g->allweak,(GCObject *)0x0);
  pGVar1 = g->weak;
  pGVar2 = g->allweak;
  separatetobefnz(g,0);
  markbeingfnz(g);
  while (g->gray != (GCObject *)0x0) {
    propagatemark(g);
  }
  convergeephemerons(g);
  clearbykeys(g,g->ephemeron);
  clearbykeys(g,g->allweak);
  clearbyvalues(g,g->weak,pGVar1);
  clearbyvalues(g,g->allweak,pGVar2);
  luaS_clearcache(g);
  g->currentwhite = g->currentwhite ^ 0x18;
  return;
}

Assistant:

static void atomic (lua_State *L) {
  global_State *g = G(L);
  GCObject *origweak, *origall;
  GCObject *grayagain = g->grayagain;  /* save original list */
  g->grayagain = NULL;
  lua_assert(g->ephemeron == NULL && g->weak == NULL);
  lua_assert(!iswhite(mainthread(g)));
  g->gcstate = GCSatomic;
  markobject(g, L);  /* mark running thread */
  /* registry and global metatables may be changed by API */
  markvalue(g, &g->l_registry);
  markmt(g);  /* mark global metatables */
  propagateall(g);  /* empties 'gray' list */
  /* remark occasional upvalues of (maybe) dead threads */
  remarkupvals(g);
  propagateall(g);  /* propagate changes */
  g->gray = grayagain;
  propagateall(g);  /* traverse 'grayagain' list */
  convergeephemerons(g);
  /* at this point, all strongly accessible objects are marked. */
  /* Clear values from weak tables, before checking finalizers */
  clearbyvalues(g, g->weak, NULL);
  clearbyvalues(g, g->allweak, NULL);
  origweak = g->weak; origall = g->allweak;
  separatetobefnz(g, 0);  /* separate objects to be finalized */
  markbeingfnz(g);  /* mark objects that will be finalized */
  propagateall(g);  /* remark, to propagate 'resurrection' */
  convergeephemerons(g);
  /* at this point, all resurrected objects are marked. */
  /* remove dead objects from weak tables */
  clearbykeys(g, g->ephemeron);  /* clear keys from all ephemeron */
  clearbykeys(g, g->allweak);  /* clear keys from all 'allweak' */
  /* clear values from resurrected weak tables */
  clearbyvalues(g, g->weak, origweak);
  clearbyvalues(g, g->allweak, origall);
  luaS_clearcache(g);
  g->currentwhite = cast_byte(otherwhite(g));  /* flip current white */
  lua_assert(g->gray == NULL);
}